

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O1

void __thiscall libchars::terminal_driver::get_terminal_width_and_height(terminal_driver *this)

{
  int iVar1;
  debug *this_00;
  size_t in_RCX;
  size_t __n;
  size_t local_28;
  size_t x;
  size_t y;
  winsize ws;
  
  if (this->control_enabled == false) {
    this->changed = false;
    this->t_cols = 0;
    this->t_rows = 0;
  }
  else {
    iVar1 = this->fd_w;
    if (iVar1 < 1) {
      this->t_cols = 0;
      this->t_rows = 0;
      this->changed = true;
    }
    else if (this->size_initialized == false) {
      y._2_2_ = 0;
      iVar1 = ioctl(iVar1,0x5413);
      if (-1 < iVar1) {
        this->size_initialized = true;
        this->t_cols = (ulong)y._2_2_;
        this->t_rows = (ulong)(ushort)y;
        if (this->control_enabled == true) {
          write(this,0x115c08,(void *)0x2,in_RCX);
        }
        cursor_to_xy(this,this->t_cols + 1,this->t_rows + 1);
        local_28 = 0;
        x = 0;
        __n = 0xffffffffffffffff;
        cursor_position(this,&local_28,&x,-1);
        if (this->control_enabled == true) {
          write(this,0x115c0a,(void *)0x2,__n);
        }
        if ((local_28 != this->t_cols) || (x != this->t_rows)) {
          this->t_cols = local_28;
          this->t_rows = x;
          this->size_not_accurate = true;
        }
      }
    }
    else if (this->size_not_accurate == false) {
      y._2_2_ = 0;
      iVar1 = ioctl(iVar1,0x5413);
      if ((-1 < iVar1) && ((this->t_cols != (ulong)y._2_2_ || (this->t_rows != (ulong)(ushort)y))))
      {
        this_00 = debug::initialize(0);
        debug::log(this_00,(double)this->t_cols);
        this->changed = this->t_rows != 0 || this->t_cols != 0;
        this->t_cols = (ulong)y._2_2_;
        this->t_rows = (ulong)(ushort)y;
      }
    }
  }
  return;
}

Assistant:

void terminal_driver::get_terminal_width_and_height()
    {
        if (!control_enabled) {
            t_cols = t_rows = 0;
            changed = false;
        }
        else if (fd_w > 0) {
            if (!size_initialized) {
                struct winsize ws;
                ws.ws_col = 0;
                if (ioctl(fd_w, TIOCGWINSZ, &ws) >= 0) {
                    size_initialized = true;
                    t_cols = ws.ws_col;
                    t_rows = ws.ws_row;
                    // make sure size is accurate
                    cursor_save();
                    cursor_to_xy(t_cols + 1, t_rows + 1);
                    size_t x = 0, y = 0;
                    cursor_position(x,y);
                    cursor_restore();
                    if (x != t_cols || y != t_rows) {
                        t_cols = x;
                        t_rows = y;
                        size_not_accurate = true;
                    }
                }
            }
            else if (size_not_accurate) {
                // do not try to update window size
                return;
            }
            else {
                struct winsize ws;
                ws.ws_col = 0;
                if (ioctl(fd_w, TIOCGWINSZ, &ws) >= 0) {
                    if (t_cols != ws.ws_col || t_rows != ws.ws_row) {
                        LC_LOG_VERBOSE("window[%zux%zu]-->[%ux%u]",t_cols,t_rows,ws.ws_col,ws.ws_row);
                        changed = (t_cols != 0 || t_rows != 0);
                        t_cols = ws.ws_col;
                        t_rows = ws.ws_row;
                    }
                }
            }
        }
        else {
            t_cols = t_rows = 0;
            changed = true;
        }
    }